

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CopyPtr.h
# Opt level: O0

CopyPtr<slang::SVUnion> * __thiscall
slang::CopyPtr<slang::SVUnion>::operator=
          (CopyPtr<slang::SVUnion> *this,CopyPtr<slang::SVUnion> *other)

{
  SVUnion *pSVar1;
  CopyPtr<slang::SVUnion> *in_RSI;
  CopyPtr<slang::SVUnion> *in_RDI;
  size_t in_stack_ffffffffffffffc8;
  SVUnion *this_00;
  
  if (in_RDI != in_RSI) {
    this_00 = in_RDI->ptr;
    if (this_00 != (SVUnion *)0x0) {
      SVUnion::~SVUnion((SVUnion *)0x34611c);
      operator_delete(this_00,in_stack_ffffffffffffffc8);
    }
    pSVar1 = (SVUnion *)operator_new(0x346135);
    SVUnion::SVUnion(this_00,pSVar1);
    in_RDI->ptr = pSVar1;
  }
  return in_RDI;
}

Assistant:

CopyPtr& operator=(const CopyPtr& other) {
        if (this != &other) {
            delete ptr;
            ptr = new T(*other.ptr);
        }
        return *this;
    }